

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Floor.cpp
# Opt level: O0

void __thiscall Floor::draw(Floor *this)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  int local_14;
  int i;
  Floor *this_local;
  
  drawWholeRect(this->x,this->y,this->w,this->h,0);
  for (local_14 = 0; sVar5 = std::vector<Info,_std::allocator<Info>_>::size(&this->infos),
      (ulong)(long)local_14 < sVar5; local_14 = local_14 + 1) {
    pvVar6 = std::vector<Info,_std::allocator<Info>_>::operator[](&this->infos,(long)local_14);
    switch(pvVar6->type) {
    case 0:
      break;
    case 1:
      iVar3 = this->x;
      iVar4 = this->y;
      pvVar6 = std::vector<Info,_std::allocator<Info>_>::operator[](&this->infos,(long)local_14);
      drawLine(iVar3 + local_14,iVar4,pvVar6->height,false,7);
      break;
    case 2:
      iVar3 = this->x;
      iVar4 = this->y;
      pvVar6 = std::vector<Info,_std::allocator<Info>_>::operator[](&this->infos,(long)local_14);
      iVar1 = pvVar6->height;
      iVar2 = this->h;
      pvVar6 = std::vector<Info,_std::allocator<Info>_>::operator[](&this->infos,(long)local_14);
      drawLine(iVar3 + local_14,iVar4 - (iVar1 - iVar2),pvVar6->height - this->h,false,1);
      break;
    case 3:
      iVar3 = this->x;
      iVar4 = this->y;
      pvVar6 = std::vector<Info,_std::allocator<Info>_>::operator[](&this->infos,(long)local_14);
      drawLine(iVar3 + local_14,iVar4,pvVar6->height,false,3);
      break;
    case 4:
      iVar3 = this->x;
      iVar4 = this->y;
      pvVar6 = std::vector<Info,_std::allocator<Info>_>::operator[](&this->infos,(long)local_14);
      drawLine(iVar3 + local_14,iVar4,pvVar6->height,false,5);
    }
  }
  return;
}

Assistant:

void Floor::draw(){
    drawWholeRect(x, y, w, h, BLACK);
    for(int i = 0; i < infos.size(); ++i){
        switch(infos[i].type){
        case NORMAL_FLOOR:
            break;
        case BREAK_FLOOR:
            drawLine(x+i, y, infos[i].height, 0, WHITE);
            break;
        case DEATH_FLOOR:
            drawLine(x+i, y-(infos[i].height-h), infos[i].height-h, 0, RED);
            break;
        case SCORE_FLOOR:
            drawLine(x+i, y, infos[i].height, 0, YELLOW);
            break;
        case FLOAT_FLOOR:
            drawLine(x+i, y, infos[i].height, 0, PURPLE);
            break;
        }
    }
}